

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

void __thiscall
TPZBlockDiagonal<std::complex<double>_>::TPZBlockDiagonal
          (TPZBlockDiagonal<std::complex<double>_> *this,TPZBlockDiagonal<std::complex<double>_> *A)

{
  TPZVec<long> *copy;
  long *in_RSI;
  TPZVec<std::complex<double>_> *in_RDI;
  TPZVec<std::complex<double>_> *unaff_retaddr;
  void **in_stack_ffffffffffffffc8;
  TPZMatrix<std::complex<double>_> *in_stack_ffffffffffffffd0;
  TPZVec<std::complex<double>_> *copy_00;
  
  copy_00 = in_RDI;
  TPZRegisterClassId::TPZRegisterClassId<TPZBlockDiagonal<std::complex<double>>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  copy = (TPZVec<long> *)(**(code **)(*in_RSI + 0x60))();
  (**(code **)(*in_RSI + 0x60))();
  TPZMatrix<std::complex<double>_>::TPZMatrix
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(int64_t)in_RDI,(int64_t)copy);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZBlockDiagonal_023f1580;
  TPZVec<std::complex<double>_>::TPZVec(unaff_retaddr,copy_00);
  TPZVec<long>::TPZVec((TPZVec<long> *)in_RDI,copy);
  TPZVec<int>::TPZVec((TPZVec<int> *)in_RDI,(TPZVec<int> *)copy);
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::TPZBlockDiagonal (const TPZBlockDiagonal<TVar> & A)
: TPZRegisterClassId(&TPZBlockDiagonal::ClassId),
TPZMatrix<TVar>( A.Dim(), A.Dim() ), fStorage(A.fStorage),
fBlockPos(A.fBlockPos), fBlockSize(A.fBlockSize)
{
}